

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O2

void __thiscall
script_standard_tests::script_standard_ExtractDestination::test_method
          (script_standard_ExtractDestination *this)

{
  long lVar1;
  undefined8 data;
  bool bVar2;
  readonly_property<bool> rVar3;
  CScript *pCVar4;
  variant_alternative_t<1UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *a;
  BaseHash<uint160> *pBVar5;
  CSHA256 *this_00;
  BaseHash<uint256> *this_01;
  variant_alternative_t<8UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *w1;
  uint uVar6;
  size_t len;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_01;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_03;
  const_string file_04;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_05;
  initializer_list<unsigned_char> __l;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_06;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_07;
  Span<unsigned_char> output;
  const_string file_08;
  span<const_std::byte,_18446744073709551615UL> b_05;
  const_string file_09;
  const_string file_10;
  span<const_std::byte,_18446744073709551615UL> b_06;
  const_string file_11;
  const_string file_12;
  check_type cVar9;
  char *local_4b0;
  char *local_4a8;
  assertion_result local_4a0;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  CKey key;
  assertion_result local_1e8;
  char **local_1d0;
  WitnessV0ScriptHash scripthash;
  WitnessUnknown unk;
  WitnessV0KeyHash keyhash;
  CScript redeemScript;
  CTxDestination address;
  CScript s;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&key,0));
  CKey::GetPubKey(&pubkey,&key);
  s.super_CScriptBase._union._16_8_ = 0;
  s.super_CScriptBase._24_8_ = 0;
  s.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  s.super_CScriptBase._union._8_8_ = 0;
  address.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._16_8_ = 0;
  address.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._24_8_ = 0;
  address.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._0_8_ = 0;
  address.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._8_8_ = 0;
  address.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_index = '\0';
  CScript::clear(&s);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,&pubkey);
  b._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b._M_ptr = (pointer)unk._0_8_;
  pCVar4 = CScript::operator<<(&s,b);
  CScript::operator<<(pCVar4,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xe5;
  file.m_begin = (iterator)&local_208;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  bVar2 = ExtractDestination(&s,&address);
  redeemScript.super_CScriptBase._union.direct[0] = !bVar2;
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&scripthash;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       anon_var_dwarf_ec083b;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!ExtractDestination(s, address)" + 0x1f;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_220 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&redeemScript,(lazy_ostream *)&unk,1,0,WARN,_cVar9,
             (size_t)&local_228,0xe5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&redeemScript.super_CScriptBase._union + 0x10));
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0xe6;
  file_00.m_begin = (iterator)&local_238;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  a = std::
      get<1ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                (&address);
  memcpy(&unk,&pubkey,0x41);
  bVar2 = ::operator==(&a->m_pubkey,(CPubKey *)&unk);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] = bVar2;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1e8._0_8_ = "std::get<PubKeyDestination>(address) == PubKeyDestination(pubkey)";
  local_1e8.m_message.px = (element_type *)0xbc34dd;
  redeemScript.super_CScriptBase._union._8_8_ =
       redeemScript.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  redeemScript.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  redeemScript.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_250 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  redeemScript.super_CScriptBase._24_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scripthash,(lazy_ostream *)&redeemScript,1,0,WARN,_cVar9,
             (size_t)&local_258,0xe6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems + 0x10
             ));
  CScript::clear(&s);
  pCVar4 = CScript::operator<<(&s,OP_DUP);
  pCVar4 = CScript::operator<<(pCVar4,OP_HASH160);
  CPubKey::GetID((CKeyID *)&redeemScript,&pubkey);
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,(CKeyID *)&redeemScript);
  b_00._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b_00._M_ptr = (pointer)unk._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_00);
  pCVar4 = CScript::operator<<(pCVar4,OP_EQUALVERIFY);
  CScript::operator<<(pCVar4,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  file_01.m_end = (iterator)0xeb;
  file_01.m_begin = (iterator)&local_268;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
             msg_01);
  bVar2 = ExtractDestination(&s,&address);
  redeemScript.super_CScriptBase._union.direct[0] = bVar2;
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (long)"!ExtractDestination(s, address)" + 1;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!ExtractDestination(s, address)" + 0x1f;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_280 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&scripthash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&redeemScript,(lazy_ostream *)&unk,1,0,WARN,_cVar9,
             (size_t)&local_288,0xeb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&redeemScript.super_CScriptBase._union + 0x10));
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0xec;
  file_02.m_begin = (iterator)&local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
             msg_02);
  pBVar5 = &std::
            get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      (&address)->super_BaseHash<uint160>;
  PKHash::PKHash((PKHash *)&scripthash,&pubkey);
  bVar2 = BaseHash<uint160>::operator==(pBVar5,(BaseHash<uint160> *)&scripthash);
  redeemScript.super_CScriptBase._union.direct[0] = bVar2;
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  local_1e8._0_8_ = "std::get<PKHash>(address) == PKHash(pubkey)";
  local_1e8.m_message.px = (element_type *)0xbc3509;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2b0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&redeemScript,(lazy_ostream *)&unk,1,0,WARN,_cVar9,
             (size_t)&local_2b8,0xec);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&redeemScript.super_CScriptBase._union + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&redeemScript.super_CScriptBase,&s.super_CScriptBase);
  CScript::clear(&s);
  pCVar4 = CScript::operator<<(&s,OP_HASH160);
  CScriptID::CScriptID((CScriptID *)&scripthash,&redeemScript);
  ToByteVector<CScriptID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,(CScriptID *)&scripthash)
  ;
  b_01._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b_01._M_ptr = (pointer)unk._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_01);
  CScript::operator<<(pCVar4,OP_EQUAL);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  file_03.m_end = (iterator)0xf2;
  file_03.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  bVar2 = ExtractDestination(&s,&address);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1e8._0_8_ = "ExtractDestination(s, address)";
  local_1e8.m_message.px = (element_type *)0xbc349b;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_1e8;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scripthash,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_2e8
             ,0xf2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems + 0x10
             ));
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  file_04.m_end = (iterator)0xf3;
  file_04.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  pBVar5 = &std::
            get<3ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      (&address)->super_BaseHash<uint160>;
  ScriptHash::ScriptHash((ScriptHash *)&local_1e8,&redeemScript);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] =
       BaseHash<uint160>::operator==(pBVar5,(BaseHash<uint160> *)&local_1e8);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_4a0;
  local_4a0._0_8_ = "std::get<ScriptHash>(address) == ScriptHash(redeemScript)";
  local_4a0.m_message.px = (element_type *)0xbc3543;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_310 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scripthash,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_318
             ,0xf3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems + 0x10
             ));
  CScript::clear(&s);
  pCVar4 = CScript::operator<<(&s,OP_1);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,&pubkey);
  b_02._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b_02._M_ptr = (pointer)unk._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_02);
  pCVar4 = CScript::operator<<(pCVar4,OP_1);
  CScript::operator<<(pCVar4,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  file_05.m_end = (iterator)0xf8;
  file_05.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  bVar2 = ExtractDestination(&s,&address);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] = !bVar2;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1e8._0_8_ = "!ExtractDestination(s, address)";
  local_1e8.m_message.px = (element_type *)0xbc349b;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_340 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scripthash,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_348
             ,0xf8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems + 0x10
             ));
  CScript::clear(&s);
  pCVar4 = CScript::operator<<(&s,OP_RETURN);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] = 'K';
  __l._M_len = 1;
  __l._M_array = (iterator)&scripthash;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,__l,
             (allocator_type *)&local_1e8);
  b_03._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b_03._M_ptr = (pointer)unk._0_8_;
  CScript::operator<<(pCVar4,b_03);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  file_06.m_end = (iterator)0xfd;
  file_06.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
             msg_06);
  bVar2 = ExtractDestination(&s,&address);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] = !bVar2;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1e8._0_8_ = "!ExtractDestination(s, address)";
  local_1e8.m_message.px = (element_type *)0xbc349b;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_370 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scripthash,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_378
             ,0xfd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems + 0x10
             ));
  CScript::clear(&s);
  pCVar4 = CScript::operator<<(&s,OP_0);
  CPubKey::GetID((CKeyID *)&scripthash,&pubkey);
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,(CKeyID *)&scripthash);
  b_04._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b_04._M_ptr = (pointer)unk._0_8_;
  CScript::operator<<(pCVar4,b_04);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  file_07.m_end = (iterator)0x102;
  file_07.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_398,
             msg_07);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] =
       ExtractDestination(&s,&address);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1e8._0_8_ = "ExtractDestination(s, address)";
  local_1e8.m_message.px = (element_type *)0xbc349b;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3a0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scripthash,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_3a8
             ,0x102);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems + 0x10
             ));
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  keyhash.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unk.m_version = 0;
  unk._4_4_ = 0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  CSHA256::CSHA256((CSHA256 *)&unk);
  if ((pubkey.vch[0] & 0xfe) == 2) {
    len = 0x21;
  }
  else if ((byte)(pubkey.vch[0] - 4) < 4) {
    len = *(size_t *)(&DAT_00b5ace0 + (ulong)(byte)(pubkey.vch[0] - 4) * 8);
  }
  else {
    len = 0;
  }
  CSHA256::Write((CSHA256 *)&unk,pubkey.vch,len);
  output.m_size = 0x14;
  output.m_data = (uchar *)&keyhash;
  CHash160::Finalize((CHash160 *)&unk,output);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  file_08.m_end = (iterator)0x105;
  file_08.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c8,
             msg_08);
  pBVar5 = &std::
            get<5ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      (&address)->super_BaseHash<uint160>;
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] =
       BaseHash<uint160>::operator==(pBVar5,&keyhash.super_BaseHash<uint160>);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1e8._0_8_ = "std::get<WitnessV0KeyHash>(address) == keyhash";
  local_1e8.m_message.px = (element_type *)0xbc3572;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3d0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scripthash,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_3d8
             ,0x105);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems + 0x10
             ));
  CScript::clear(&s);
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scripthash.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::CSHA256((CSHA256 *)&unk);
  uVar6 = redeemScript.super_CScriptBase._size - 0x1d;
  data = redeemScript.super_CScriptBase._union.indirect_contents.indirect;
  if (redeemScript.super_CScriptBase._size < 0x1d) {
    uVar6 = redeemScript.super_CScriptBase._size;
    data = &redeemScript;
  }
  this_00 = CSHA256::Write((CSHA256 *)&unk,(uchar *)data,(ulong)uVar6);
  CSHA256::Finalize(this_00,(uchar *)&scripthash);
  pCVar4 = CScript::operator<<(&s,OP_0);
  ToByteVector<WitnessV0ScriptHash>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,&scripthash);
  b_05._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b_05._M_ptr = (pointer)unk._0_8_;
  CScript::operator<<(pCVar4,b_05);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  file_09.m_end = (iterator)0x10c;
  file_09.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3f8,
             msg_09);
  rVar3.super_class_property<bool>.value = (class_property<bool>)ExtractDestination(&s,&address);
  local_1e8.m_message.px = (element_type *)0x0;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "ExtractDestination(s, address)";
  local_4a0.m_message.px = (element_type *)0xbc349b;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_4a0;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_400 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e8,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_408,0x10c);
  boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  file_10.m_end = (iterator)0x10d;
  file_10.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_428,
             msg_10);
  this_01 = &std::
             get<4ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                       (&address)->super_BaseHash<uint256>;
  local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BaseHash<uint256>::operator==(this_01,&scripthash.super_BaseHash<uint256>);
  local_1e8.m_message.px = (element_type *)0x0;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "std::get<WitnessV0ScriptHash>(address) == scripthash";
  local_4a0.m_message.px = (element_type *)0xbc35a7;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_4a0;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_430 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e8,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_438,0x10d);
  boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
  CScript::clear(&s);
  pCVar4 = CScript::operator<<(&s,OP_1);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&unk,&pubkey);
  b_06._M_extent._M_extent_value =
       (long)unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start - unk._0_8_;
  b_06._M_ptr = (pointer)unk._0_8_;
  CScript::operator<<(pCVar4,b_06);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unk);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  file_11.m_end = (iterator)0x112;
  file_11.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_458,
             msg_11);
  local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ExtractDestination(&s,&address);
  local_1e8.m_message.px = (element_type *)0x0;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "ExtractDestination(s, address)";
  local_4a0.m_message.px = (element_type *)0xbc349b;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)unk.m_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  unk._0_8_ = &PTR__lazy_ostream_0113a070;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_4a0;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_460 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e8,(lazy_ostream *)&unk,1,0,WARN,_cVar9,(size_t)&local_468,0x112);
  boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8,&pubkey)
  ;
  unk.m_version = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&unk.m_program,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  file_12.m_end = (iterator)0x114;
  file_12.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_488,
             msg_12);
  w1 = std::
       get<8ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 (&address);
  bVar2 = ::operator==(w1,&unk);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d0 = &local_4b0;
  local_4b0 = "std::get<WitnessUnknown>(address) == unk";
  local_4a8 = "";
  local_1e8.m_message.px = (element_type *)((ulong)local_1e8.m_message.px & 0xffffffffffffff00);
  local_1e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_1e8,1,0,WARN,0xbc2f63,
             (size_t)&stack0xfffffffffffffb40,0x114);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&unk.m_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&redeemScript.super_CScriptBase);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&address);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&s.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_ExtractDestination)
{
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    CScript s;
    CTxDestination address;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkey) << OP_CHECKSIG;
    BOOST_CHECK(!ExtractDestination(s, address));
    BOOST_CHECK(std::get<PubKeyDestination>(address) == PubKeyDestination(pubkey));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkey.GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<PKHash>(address) == PKHash(pubkey));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<ScriptHash>(address) == ScriptHash(redeemScript));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 << ToByteVector(pubkey) << OP_1 << OP_CHECKMULTISIG;
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN << std::vector<unsigned char>({75});
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkey.GetID());
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessV0KeyHash keyhash;
    CHash160().Write(pubkey).Finalize(keyhash);
    BOOST_CHECK(std::get<WitnessV0KeyHash>(address) == keyhash);

    // TxoutType::WITNESS_V0_SCRIPTHASH
    s.clear();
    WitnessV0ScriptHash scripthash;
    CSHA256().Write(redeemScript.data(), redeemScript.size()).Finalize(scripthash.begin());
    s << OP_0 << ToByteVector(scripthash);
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<WitnessV0ScriptHash>(address) == scripthash);

    // TxoutType::WITNESS_UNKNOWN with unknown version
    s.clear();
    s << OP_1 << ToByteVector(pubkey);
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessUnknown unk{1, ToByteVector(pubkey)};
    BOOST_CHECK(std::get<WitnessUnknown>(address) == unk);
}